

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.hpp
# Opt level: O1

compiler_token_type __thiscall
boost::xpressive::
compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
get_escape_token<char_const*>
          (compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           *this,char **begin,char *end)

{
  byte bVar1;
  byte *pbVar2;
  compiler_token_type cVar3;
  
  pbVar2 = (byte *)*begin;
  cVar3 = token_escape;
  if (pbVar2 != (byte *)end) {
    bVar1 = *pbVar2;
    if (bVar1 < 0x51) {
      switch(bVar1) {
      case 0x3c:
        cVar3 = token_assert_word_begin;
        break;
      default:
        goto switchD_0012801f_caseD_3d;
      case 0x3e:
        cVar3 = token_assert_word_end;
        break;
      case 0x41:
        cVar3 = token_assert_begin_sequence;
        break;
      case 0x42:
        cVar3 = token_assert_not_word_boundary;
        break;
      case 0x45:
        cVar3 = token_quote_meta_end;
      }
    }
    else if (bVar1 == 0x51) {
      cVar3 = token_quote_meta_begin;
    }
    else if (bVar1 == 0x5a) {
      cVar3 = token_assert_end_sequence;
    }
    else {
      if (bVar1 != 0x62) {
        return token_escape;
      }
      cVar3 = token_assert_word_boundary;
    }
    *begin = (char *)(pbVar2 + 1);
  }
switchD_0012801f_caseD_3d:
  return cVar3;
}

Assistant:

regex_constants::compiler_token_type get_escape_token(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        if(begin != end)
        {
            switch(*begin)
            {
            //case BOOST_XPR_CHAR_(char_type, 'a'): ++begin; return token_escape_bell;
            //case BOOST_XPR_CHAR_(char_type, 'c'): ++begin; return token_escape_control;
            //case BOOST_XPR_CHAR_(char_type, 'e'): ++begin; return token_escape_escape;
            //case BOOST_XPR_CHAR_(char_type, 'f'): ++begin; return token_escape_formfeed;
            //case BOOST_XPR_CHAR_(char_type, 'n'): ++begin; return token_escape_newline;
            //case BOOST_XPR_CHAR_(char_type, 't'): ++begin; return token_escape_horizontal_tab;
            //case BOOST_XPR_CHAR_(char_type, 'v'): ++begin; return token_escape_vertical_tab;
            case BOOST_XPR_CHAR_(char_type, 'A'): ++begin; return token_assert_begin_sequence;
            case BOOST_XPR_CHAR_(char_type, 'b'): ++begin; return token_assert_word_boundary;
            case BOOST_XPR_CHAR_(char_type, 'B'): ++begin; return token_assert_not_word_boundary;
            case BOOST_XPR_CHAR_(char_type, 'E'): ++begin; return token_quote_meta_end;
            case BOOST_XPR_CHAR_(char_type, 'Q'): ++begin; return token_quote_meta_begin;
            case BOOST_XPR_CHAR_(char_type, 'Z'): ++begin; return token_assert_end_sequence;
            // Non-standard extension to ECMAScript syntax
            case BOOST_XPR_CHAR_(char_type, '<'): ++begin; return token_assert_word_begin;
            case BOOST_XPR_CHAR_(char_type, '>'): ++begin; return token_assert_word_end;
            default:; // fall-through
            }
        }

        return token_escape;
    }